

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaderparser_p.h
# Opt level: O0

void __thiscall
QHttpHeaderParser::QHttpHeaderParser(QHttpHeaderParser *this,QHttpHeaderParser *param_2)

{
  QString *in_RSI;
  QString *in_RDI;
  
  QHttpHeaders::QHttpHeaders((QHttpHeaders *)in_RSI,(QHttpHeaders *)in_RDI);
  QString::QString(in_RSI,in_RDI);
  memcpy(&in_RDI[1].d.ptr,&in_RSI[1].d.ptr,0x28);
  return;
}

Assistant:

class Q_NETWORK_EXPORT QHttpHeaderParser
{
public:
    QHttpHeaderParser();

    void clear();
    bool parseHeaders(QByteArrayView headers);
    bool parseStatus(QByteArrayView status);

    const QHttpHeaders& headers() const &;
    QHttpHeaders headers() &&;
    void setStatusCode(int code);
    int getStatusCode() const;
    int getMajorVersion() const;
    void setMajorVersion(int version);
    int getMinorVersion() const;
    void setMinorVersion(int version);
    QString getReasonPhrase() const;
    void setReasonPhrase(const QString &reason);

    QByteArray firstHeaderField(QByteArrayView name,
                                const QByteArray &defaultValue = QByteArray()) const;
    QByteArray combinedHeaderValue(QByteArrayView name,
                                   const QByteArray &defaultValue = QByteArray()) const;
    QList<QByteArray> headerFieldValues(QByteArrayView name) const;
    void setHeaderField(const QByteArray &name, const QByteArray &data);
    void prependHeaderField(const QByteArray &name, const QByteArray &data);
    void appendHeaderField(const QByteArray &name, const QByteArray &data);
    void removeHeaderField(QByteArrayView name);
    void clearHeaders();

    void setMaxHeaderFieldSize(qsizetype size) { maxFieldSize = size; }
    qsizetype maxHeaderFieldSize() const { return maxFieldSize; }

    void setMaxTotalHeaderSize(qsizetype size) { maxTotalSize = size; }
    qsizetype maxTotalHeaderSize() const { return maxTotalSize; }

    void setMaxHeaderFields(qsizetype count) { maxFieldCount = count; }
    qsizetype maxHeaderFields() const { return maxFieldCount; }

private:
    QHttpHeaders fields;
    QString reasonPhrase;
    int statusCode;
    int majorVersion;
    int minorVersion;

    qsizetype maxFieldSize = HeaderConstants::MAX_HEADER_FIELD_SIZE;
    qsizetype maxTotalSize = HeaderConstants::MAX_TOTAL_HEADER_SIZE;
    qsizetype maxFieldCount = HeaderConstants::MAX_HEADER_FIELDS;
}